

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_packed_uint.h
# Opt level: O0

packed_uint<4U> * __thiscall crnlib::packed_uint<4U>::operator=(packed_uint<4U> *this,uint val)

{
  uint i;
  uint val_local;
  packed_uint<4U> *this_local;
  
  val_local = val;
  for (i = 0; i < 4; i = i + 1) {
    this[i] = SUB41(val_local >> 0x18,0);
    val_local = val_local << 8;
  }
  return this;
}

Assistant:

inline packed_uint& operator=(unsigned int val) {
#ifdef CRNLIB_BUILD_DEBUG
    if (N == 1) {
      CRNLIB_ASSERT(val <= 0xFFU);
    } else if (N == 2) {
      CRNLIB_ASSERT(val <= 0xFFFFU);
    } else if (N == 3) {
      CRNLIB_ASSERT(val <= 0xFFFFFFU);
    }
#endif

    val <<= (8U * (4U - N));

    for (unsigned int i = 0; i < N; i++) {
      m_buf[i] = static_cast<unsigned char>(val >> 24U);
      val <<= 8U;
    }

    return *this;
  }